

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datareader.cpp
# Opt level: O2

int __thiscall ncnn::DataReaderFromMemory::scan(DataReaderFromMemory *this,char *format,void *p)

{
  uchar **ppuVar1;
  uint in_EAX;
  int iVar2;
  size_t sVar3;
  char *__s;
  int nconsumed;
  undefined8 uStack_38;
  
  uStack_38._0_4_ = in_EAX;
  sVar3 = strlen(format);
  __s = (char *)operator_new__(sVar3 + 4);
  sprintf(__s,"%s%%n",format);
  uStack_38 = (ulong)(uint)uStack_38;
  iVar2 = __isoc99_sscanf(*this->d->mem,__s,p,(long)&uStack_38 + 4);
  ppuVar1 = this->d->mem;
  *ppuVar1 = *ppuVar1 + uStack_38._4_4_;
  operator_delete__(__s);
  if (uStack_38._4_4_ < 1) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int DataReaderFromMemory::scan(const char* format, void* p) const
{
    size_t fmtlen = strlen(format);

    char* format_with_n = new char[fmtlen + 4];
    sprintf(format_with_n, "%s%%n", format);

    int nconsumed = 0;
    int nscan = sscanf((const char*)d->mem, format_with_n, p, &nconsumed);
    d->mem += nconsumed;

    delete[] format_with_n;

    return nconsumed > 0 ? nscan : 0;
}